

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReplayingHammerer.cpp
# Opt level: O2

void __thiscall
ReplayingHammerer::run_refresh_alignment_experiment
          (ReplayingHammerer *this,PatternAddressMapper *mapper)

{
  CodeJitter *code_jitter;
  string *__k;
  size_t sVar1;
  string local_80;
  mapped_type *local_60;
  string local_58;
  allocator<char> local_31;
  
  code_jitter = PatternAddressMapper::get_code_jitter(mapper);
  __k = PatternAddressMapper::get_instance_id_abi_cxx11_(mapper);
  local_60 = std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_HammeringPattern>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_HammeringPattern>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::at((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_HammeringPattern>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_HammeringPattern>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   *)&this->map_mapping_id_to_pattern,__k);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"Hammering pattern for 10x100M activations.",
             (allocator<char> *)&local_80);
  Logger::log_info(&local_58,true);
  std::__cxx11::string::~string((string *)&local_58);
  sVar1 = hammer_pattern(this,&this->params,code_jitter,local_60,mapper,
                         code_jitter->flushing_strategy,code_jitter->fencing_strategy,10,
                         code_jitter->num_aggs_for_sync,100000000,false,
                         code_jitter->pattern_sync_each_ref,false,false,false,false,true);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,"total bit flips = %d",&local_31);
  format_string<unsigned_long>(&local_58,&local_80,sVar1);
  Logger::log_data(&local_58,true);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"Hammering pattern for 10x10M activations.",
             (allocator<char> *)&local_80);
  Logger::log_info(&local_58,true);
  std::__cxx11::string::~string((string *)&local_58);
  sVar1 = hammer_pattern(this,&this->params,code_jitter,local_60,mapper,
                         code_jitter->flushing_strategy,code_jitter->fencing_strategy,10,
                         code_jitter->num_aggs_for_sync,10000000,false,
                         code_jitter->pattern_sync_each_ref,false,false,false,false,true);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,"total bit flips = %d",&local_31);
  format_string<unsigned_long>(&local_58,&local_80,sVar1);
  Logger::log_data(&local_58,true);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_80);
  return;
}

Assistant:

[[maybe_unused]] void ReplayingHammerer::run_refresh_alignment_experiment(PatternAddressMapper &mapper) {
  auto &cj = mapper.get_code_jitter();
  auto &patt = map_mapping_id_to_pattern.at(mapper.get_instance_id());

  Logger::log_info("Hammering pattern for 10x100M activations.");
  size_t num_bit_flips = hammer_pattern(params, cj, patt, mapper, cj.flushing_strategy, cj.fencing_strategy, 10,
      cj.num_aggs_for_sync, M(100), false, cj.pattern_sync_each_ref, false, false, false, false, true);
  Logger::log_data(format_string("total bit flips = %d", num_bit_flips));

  Logger::log_info("Hammering pattern for 10x10M activations.");
  num_bit_flips = hammer_pattern(params, cj, patt, mapper, cj.flushing_strategy, cj.fencing_strategy, 10,
      cj.num_aggs_for_sync, M(10), false, cj.pattern_sync_each_ref, false, false, false, false, true);
  Logger::log_data(format_string("total bit flips = %d", num_bit_flips));
}